

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool IsValidEdgeFaceLink(ON_SubDEdge *edge,ON_SubDFace *face,uint edge_face_index,
                        uint face_edge_index,bool bSilentError)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  ON_SubDFace *pOVar4;
  ON_SubDEdge *pOVar5;
  uint local_3c;
  uint local_38;
  uint i_1;
  uint i;
  uint face_edge_count;
  uint edge_face_count;
  uint uStack_24;
  bool bSilentError_local;
  uint face_edge_index_local;
  uint edge_face_index_local;
  ON_SubDFace *face_local;
  ON_SubDEdge *edge_local;
  
  if ((edge == (ON_SubDEdge *)0x0) || (face == (ON_SubDFace *)0x0)) {
    edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
  else {
    uVar2 = ON_SubDComponentBase::SubdivisionLevel(&edge->super_ON_SubDComponentBase);
    uVar3 = ON_SubDComponentBase::SubdivisionLevel(&face->super_ON_SubDComponentBase);
    if (uVar2 == uVar3) {
      uVar2 = (uint)edge->m_face_count;
      if (uVar2 == 0) {
        edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
      }
      else if ((uVar2 < 3) || (edge->m_facex != (ON_SubDFacePtr *)0x0)) {
        if ((edge_face_index < uVar2) || (edge_face_index == 0xffffffff)) {
          uVar3 = (uint)face->m_edge_count;
          if (uVar3 == 0) {
            edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
          }
          else if ((uVar3 < 5) || (face->m_edgex != (ON_SubDEdgePtr *)0x0)) {
            if ((face_edge_index < uVar3) || (face_edge_index == 0xffffffff)) {
              uStack_24 = edge_face_index;
              for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
                pOVar4 = ON_SubDEdge::Face(edge,local_38);
                if (face == pOVar4) {
                  if (uStack_24 == 0xffffffff) {
                    uStack_24 = local_38;
                  }
                  else if (local_38 != uStack_24) {
                    bVar1 = ON_SubDIsNotValid(bSilentError);
                    return bVar1;
                  }
                }
                else if (local_38 == uStack_24) {
                  bVar1 = ON_SubDIsNotValid(bSilentError);
                  return bVar1;
                }
              }
              edge_face_count = face_edge_index;
              for (local_3c = 0; local_3c < uVar3; local_3c = local_3c + 1) {
                pOVar5 = ON_SubDFace::Edge(face,local_3c);
                if (edge == pOVar5) {
                  if (edge_face_count == 0xffffffff) {
                    edge_face_count = local_3c;
                  }
                  else if (local_3c != edge_face_count) {
                    bVar1 = ON_SubDIsNotValid(bSilentError);
                    return bVar1;
                  }
                }
                else if (local_3c == edge_face_count) {
                  bVar1 = ON_SubDIsNotValid(bSilentError);
                  return bVar1;
                }
              }
              edge_local._7_1_ = true;
            }
            else {
              edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
            }
          }
          else {
            edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
          }
        }
        else {
          edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
        }
      }
      else {
        edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
      }
    }
    else {
      edge_local._7_1_ = ON_SubDIsNotValid(bSilentError);
    }
  }
  return edge_local._7_1_;
}

Assistant:

static bool IsValidEdgeFaceLink(
  const ON_SubDEdge* edge,
  const ON_SubDFace* face,
  unsigned int edge_face_index,
  unsigned int face_edge_index,
  bool bSilentError
  )
{
  if (nullptr == edge || nullptr == face)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->SubdivisionLevel() != face->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int edge_face_count = edge->m_face_count;
  if (edge_face_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (edge_face_count > 2 && nullptr == edge->m_facex)
    return ON_SubDIsNotValid(bSilentError);

  if (edge_face_index >= edge_face_count && ON_UNSET_UINT_INDEX != edge_face_index)
    return ON_SubDIsNotValid(bSilentError);

  const unsigned int face_edge_count = face->m_edge_count;
  if (face_edge_count <= 0)
    return ON_SubDIsNotValid(bSilentError);
  if (face_edge_count > 4 && nullptr == face->m_edgex)
    return ON_SubDIsNotValid(bSilentError);

  if (face_edge_index >= face_edge_count && ON_UNSET_UINT_INDEX != face_edge_index)
    return ON_SubDIsNotValid(bSilentError);

  for (unsigned int i = 0; i < edge_face_count; i++)
  {
    if (face == edge->Face(i))
    {
      if (ON_UNSET_UINT_INDEX == edge_face_index)
        edge_face_index = i;
      else if (i != edge_face_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == edge_face_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  for (unsigned int i = 0; i < face_edge_count; i++)
  {
    if (edge == face->Edge(i))
    {
      if (ON_UNSET_UINT_INDEX == face_edge_index)
        face_edge_index = i;
      else if (i != face_edge_index)
        return ON_SubDIsNotValid(bSilentError);
    }
    else if (i == face_edge_index)
    {
      return ON_SubDIsNotValid(bSilentError);
    }
  }

  return true;
}